

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::tinyBLAS_Q0_AVX<block_q4_0,block_q8_0,float>::gemm<3,3>
          (tinyBLAS_Q0_AVX<block_q4_0,block_q8_0,float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  __m256 Cv [3] [3];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  lVar10 = (n - n0) / 3;
  lVar17 = ((m - m0) / 3) * lVar10;
  lVar11 = (lVar17 + -1 + (long)*(int *)(this + 0x3c)) / (long)*(int *)(this + 0x3c);
  lVar12 = *(int *)(this + 0x38) * lVar11;
  lVar11 = lVar11 + lVar12;
  if (lVar17 <= lVar11) {
    lVar11 = lVar17;
  }
  if (lVar12 < lVar11) {
    lVar17 = *(long *)(this + 0x18);
    lVar4 = *(long *)(this + 0x20);
    lVar5 = *(long *)this;
    lVar6 = *(long *)(this + 8);
    lVar7 = *(long *)(this + 0x28);
    lVar8 = *(long *)(this + 0x30);
    lVar9 = *(long *)(this + 0x10);
    auVar18[8] = 0xf;
    auVar18._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar18[9] = 0xf;
    auVar18[10] = 0xf;
    auVar18[0xb] = 0xf;
    auVar18[0xc] = 0xf;
    auVar18[0xd] = 0xf;
    auVar18[0xe] = 0xf;
    auVar18[0xf] = 0xf;
    auVar18[0x10] = 0xf;
    auVar18[0x11] = 0xf;
    auVar18[0x12] = 0xf;
    auVar18[0x13] = 0xf;
    auVar18[0x14] = 0xf;
    auVar18[0x15] = 0xf;
    auVar18[0x16] = 0xf;
    auVar18[0x17] = 0xf;
    auVar18[0x18] = 0xf;
    auVar18[0x19] = 0xf;
    auVar18[0x1a] = 0xf;
    auVar18[0x1b] = 0xf;
    auVar18[0x1c] = 0xf;
    auVar18[0x1d] = 0xf;
    auVar18[0x1e] = 0xf;
    auVar18[0x1f] = 0xf;
    auVar19[8] = 0xf8;
    auVar19._0_8_ = 0xf8f8f8f8f8f8f8f8;
    auVar19[9] = 0xf8;
    auVar19[10] = 0xf8;
    auVar19[0xb] = 0xf8;
    auVar19[0xc] = 0xf8;
    auVar19[0xd] = 0xf8;
    auVar19[0xe] = 0xf8;
    auVar19[0xf] = 0xf8;
    auVar19[0x10] = 0xf8;
    auVar19[0x11] = 0xf8;
    auVar19[0x12] = 0xf8;
    auVar19[0x13] = 0xf8;
    auVar19[0x14] = 0xf8;
    auVar19[0x15] = 0xf8;
    auVar19[0x16] = 0xf8;
    auVar19[0x17] = 0xf8;
    auVar19[0x18] = 0xf8;
    auVar19[0x19] = 0xf8;
    auVar19[0x1a] = 0xf8;
    auVar19[0x1b] = 0xf8;
    auVar19[0x1c] = 0xf8;
    auVar19[0x1d] = 0xf8;
    auVar19[0x1e] = 0xf8;
    auVar19[0x1f] = 0xf8;
    do {
      lVar14 = (lVar12 % lVar10) * 3 + n0;
      uStack_c0 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      uStack_a8 = 0;
      uStack_100 = 0;
      uStack_f8 = 0;
      uStack_f0 = 0;
      uStack_e8 = 0;
      local_e0 = 0;
      uStack_d8 = 0;
      uStack_d0 = 0;
      uStack_c8 = 0;
      local_140 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_110 = 0;
      uStack_108 = 0;
      local_180 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      uStack_160 = 0;
      uStack_158 = 0;
      uStack_150 = 0;
      uStack_148 = 0;
      local_1c0 = 0;
      uStack_1b8 = 0;
      uStack_1b0 = 0;
      uStack_1a8 = 0;
      uStack_1a0 = 0;
      uStack_198 = 0;
      uStack_190 = 0;
      uStack_188 = 0;
      if (0 < lVar17) {
        auVar3 = *(undefined1 (*) [16])(((lVar12 / lVar10) * 3 + m0) * lVar4 * 0x12 + lVar5 + 2);
        auVar22 = vpsrlw_avx(auVar3,4);
        auVar21._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar3;
        auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
        auVar18 = vpand_avx2(auVar21,auVar18);
        auVar18 = vpaddb_avx2(auVar18,auVar19);
        vpsignb_avx2(auVar18,auVar18);
        vpsignb_avx2(*(undefined1 (*) [32])(lVar6 + 2 + lVar14 * lVar7 * 0x22),auVar18);
        halt_baddata();
      }
      lVar14 = lVar14 * lVar8 * 4 + (lVar12 / lVar10) * 0xc + m0 * 4 + lVar9;
      puVar13 = &local_1c0;
      lVar15 = 0;
      do {
        lVar16 = 0;
        do {
          pfVar2 = (float *)(puVar13 + lVar16 + 2);
          pfVar1 = (float *)(puVar13 + lVar16);
          auVar22._0_4_ = *pfVar2 + *pfVar1;
          auVar22._4_4_ = pfVar2[1] + pfVar1[1];
          auVar22._8_4_ = pfVar2[2] + pfVar1[2];
          auVar22._12_4_ = pfVar2[3] + pfVar1[3];
          auVar3 = vshufpd_avx(auVar22,auVar22,1);
          auVar20._0_4_ = auVar22._0_4_ + auVar3._0_4_;
          auVar20._4_4_ = auVar22._4_4_ + auVar3._4_4_;
          auVar20._8_4_ = auVar22._8_4_ + auVar3._8_4_;
          auVar20._12_4_ = auVar22._12_4_ + auVar3._12_4_;
          auVar3 = vhaddps_avx(auVar20,auVar20);
          *(int *)(lVar14 + lVar16) = auVar3._0_4_;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0xc);
        lVar15 = lVar15 + 1;
        puVar13 = puVar13 + 0xc;
        lVar14 = lVar14 + lVar8 * 4;
      } while (lVar15 != 3);
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar11);
  }
  return;
}

Assistant:

NOINLINE void gemm(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][RM] = {};
            for (int64_t l = 0; l < k; ++l)
                for (int64_t j = 0; j < RN; ++j)
                    for (int64_t i = 0; i < RM; ++i) {
#if defined(__AVX2__)
                        __m256 udTmp = updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                              load(A + lda * (ii + i) + l)),
                                             _mm256_sign_epi8(load(B + ldb * (jj + j) + l),
                                                              load(A + lda * (ii + i) + l)));
#else
                        __m128i ali0 = load0(A + lda * (ii + i) + l);
                        __m128i ali1 = load1(A + lda * (ii + i) + l);
                        __m128i blj0 = load0(B + ldb * (jj + j) + l);
                        __m128i blj1 = load1(B + ldb * (jj + j) + l);

                        __m128i sepAA0 = _mm_sign_epi8(ali0, ali0);
                        __m128i sepAA1 = _mm_sign_epi8(ali1, ali1);
                        __m128i sepBA0 = _mm_sign_epi8(blj0, ali0);
                        __m128i sepBA1 = _mm_sign_epi8(blj1, ali1);

                        // updot
                        const __m128i oneFill = _mm_set1_epi16(1);
                        __m128i mad0 = _mm_maddubs_epi16(sepAA0, sepBA0);
                        __m128i mad1 = _mm_maddubs_epi16(sepAA1, sepBA1);
                        __m256 udTmp = _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_madd_epi16(oneFill, mad1), _mm_madd_epi16(oneFill, mad0)));
#endif
                        Cv[j][i] = madd(_mm256_set1_ps(unhalf(A[lda * (ii + i) + l].d) *
                                                       unhalf(B[ldb * (jj + j) + l].d)),
                                                       udTmp,
                                                       Cv[j][i]);
                    }
            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }